

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::~IfcPropertyEnumeratedValue
          (IfcPropertyEnumeratedValue *this)

{
  LazyObject *pLVar1;
  undefined1 *puVar2;
  
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcPropertyEnumeratedValue_008340d8;
  *(undefined ***)&this->field_0x48 = &PTR__IfcPropertyEnumeratedValue_00834150;
  *(undefined ***)this = &PTR__IfcPropertyEnumeratedValue_00834100;
  *(undefined ***)&this->field_0x10 = &PTR__IfcPropertyEnumeratedValue_00834128;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&this->field_0x20);
  *(undefined8 *)&this[-1].field_0x60 = 0x834268;
  *(undefined8 *)&this->field_0x48 = 0x834290;
  pLVar1 = this[-1].EnumerationReference.ptr.obj;
  if (pLVar1 != (LazyObject *)&this[-1].field_0xa0) {
    operator_delete(pLVar1);
  }
  puVar2 = (undefined1 *)
           this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>.
           aux_is_derived.super__Base_bitset<1UL>._M_w;
  if (puVar2 != &this[-1].
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>.
                 field_0x18) {
    operator_delete(puVar2);
  }
  operator_delete(&this[-1].field_0x60);
  return;
}

Assistant:

IfcPropertyEnumeratedValue() : Object("IfcPropertyEnumeratedValue") {}